

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void * get_proc(char *namez)

{
  char *local_20;
  void *result;
  char *namez_local;
  
  local_20 = (char *)0x0;
  if (libGL == (void *)0x0) {
    namez_local = (char *)0x0;
  }
  else {
    if (gladGetProcAddressPtr != (PFNGLXGETPROCADDRESSPROC_PRIVATE)0x0) {
      local_20 = (char *)(*gladGetProcAddressPtr)(namez);
    }
    if (local_20 == (char *)0x0) {
      local_20 = (char *)dlsym(libGL,namez);
    }
    namez_local = local_20;
  }
  return namez_local;
}

Assistant:

static
void* get_proc(const char *namez) {
    void* result = NULL;
    if(libGL == NULL) return NULL;

#if !defined(__APPLE__) && !defined(__HAIKU__)
    if(gladGetProcAddressPtr != NULL) {
        result = gladGetProcAddressPtr(namez);
    }
#endif
    if(result == NULL) {
#if defined(_WIN32) || defined(__CYGWIN__)
        result = (void*)GetProcAddress((HMODULE) libGL, namez);
#else
        result = dlsym(libGL, namez);
#endif
    }

    return result;
}